

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowLayoutState::deleteAllLayoutItems(QMainWindowLayoutState *this)

{
  QToolBarAreaLayout::deleteAllLayoutItems(&this->toolBarAreaLayout);
  QDockAreaLayout::deleteAllLayoutItems(&this->dockAreaLayout);
  return;
}

Assistant:

void QMainWindowLayoutState::deleteAllLayoutItems()
{
#if QT_CONFIG(toolbar)
    toolBarAreaLayout.deleteAllLayoutItems();
#endif

#if QT_CONFIG(dockwidget)
    dockAreaLayout.deleteAllLayoutItems();
#endif
}